

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O1

void __thiscall
KosarajuSCC::fillOrder
          (KosarajuSCC *this,int v,bool *visited,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *s)

{
  uint uVar1;
  pointer pvVar2;
  _Elt_pointer piVar3;
  bool bVar4;
  int iVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  int local_2c;
  
  visited[v] = true;
  pvVar2 = (this->outgoing).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = pvVar2[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_2c = v;
  if (pvVar2[v].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar6) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      uVar1 = piVar6[uVar7];
      iVar5 = (*this->_vptr_KosarajuSCC[2])(this,(ulong)uVar1);
      if ((char)iVar5 == '\0') {
        uVar1 = *(uint *)(*(long *)&(this->ends).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4);
        iVar5 = (*this->_vptr_KosarajuSCC[3])(this,(ulong)uVar1);
        if (((char)iVar5 == '\0') && (visited[(int)uVar1] == false)) {
          fillOrder(this,uVar1,visited,s);
        }
      }
      pvVar2 = (this->outgoing).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = uVar8 < (ulong)((long)pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  piVar3 = (s->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar3 == (s->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)s,&local_2c);
  }
  else {
    *piVar3 = local_2c;
    (s->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_cur = piVar3 + 1;
  }
  return;
}

Assistant:

void KosarajuSCC::fillOrder(int v, bool visited[], std::stack<int>& s) {
	// Mark the current node as visited and print it
	visited[v] = true;
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < outgoing[v].size(); ++i) {
		const int e = outgoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][1];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			fillOrder(u, visited, s);
		}
	}

	// All vertices reachable from v are processed by now, push v
	s.push(v);
}